

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

IVec2 __thiscall
deqp::gles2::Functional::sequenceSideEffCase2(Functional *this,bool in0,bool in1,Vec2 *in2)

{
  undefined7 in_register_00000031;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  Vector<float,_2> local_28;
  Vector<float,_2> local_20;
  
  local_38.m_data[0] = 1.0;
  local_38.m_data[1] = 1.0;
  tcu::operator+(in2,&local_38);
  local_30.m_data[0] = (float)(int)CONCAT71(in_register_00000031,in0);
  local_30.m_data[1] = local_30.m_data[0];
  tcu::operator+(&local_28,&local_30);
  tcu::Vector<float,_2>::cast<int>(&local_20);
  return (IVec2)(int  [2])this;
}

Assistant:

inline IVec2	sequenceSideEffCase2 (bool in0, bool in1, const Vec2& in2)						{ DE_UNREF(in1); return (in2 + Vec2(1.0f) + Vec2((float)in0)).asInt(); }